

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O1

int dmrC_dominates(dmr_C *C,pseudo_t pseudo,instruction *insn,instruction *dom,int local)

{
  uint uVar1;
  pseudo_t ppVar2;
  pseudo_t ppVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  
  uVar1 = *(uint *)dom;
  if (((char)uVar1 == '5') || (uVar7 = uVar1 & 0xff, uVar7 == 1)) {
    iVar4 = -(uint)(local == 0);
  }
  else {
    iVar4 = 0;
    if (0xfffffffd < uVar7 - 0x2b) {
      ppVar2 = (dom->field_6).field_4.phi_src;
      if (ppVar2 == pseudo) {
        uVar6 = (insn->field_6).field_5.offset;
        uVar5 = (dom->field_6).field_5.offset;
        if ((uVar6 == uVar5) && ((*(uint *)insn ^ uVar1) < 0x100)) {
          return 1;
        }
        if (uVar7 == 0x29) {
          return -1;
        }
        iVar4 = C->target->bits_in_char;
        uVar6 = uVar6 * iVar4;
        uVar5 = uVar5 * iVar4;
        bVar8 = uVar6 < (uVar1 >> 8) + uVar5 && uVar5 < (*(uint *)insn >> 8) + uVar6;
      }
      else {
        if (local != 0) {
          return 0;
        }
        ppVar3 = (insn->field_6).field_4.phi_src;
        if (ppVar3->type != PSEUDO_SYM) {
          return -1;
        }
        if (ppVar2->type != PSEUDO_SYM) {
          return -1;
        }
        bVar8 = (ppVar3->field_5).sym == (ppVar2->field_5).sym;
      }
      iVar4 = -(uint)bVar8;
    }
  }
  return iVar4;
}

Assistant:

int dmrC_dominates(struct dmr_C *C, pseudo_t pseudo, struct instruction *insn, struct instruction *dom, int local)
{
	int opcode = dom->opcode;

	if (opcode == OP_CALL || opcode == OP_ENTRY)
		return local ? 0 : -1;
	if (opcode != OP_LOAD && opcode != OP_STORE)
		return 0;
	if (dom->src != pseudo) {
		if (local)
			return 0;
		/* We don't think two explicitly different symbols ever alias */
		if (distinct_symbols(insn->src, dom->src))
			return 0;
		/* We could try to do some alias analysis here */
		return -1;
	}
	if (!same_memop(insn, dom)) {
		// TODO I think I changed this to fix some simplification issue
		// http://marc.info/?l=linux-sparse&m=148966371314267&w=2
		if (dom->opcode == OP_LOAD)
			return -1;
		if (!overlapping_memop(C, insn, dom))
			return 0;
		return -1;
	}
	return 1;
}